

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O3

int __thiscall Snes_Spc::cpu_read(Snes_Spc *this,int addr,rel_time_t time)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint8_t *puVar5;
  Timer *t;
  
  puVar5 = (this->m).ram.ram + addr;
  uVar2 = addr + 0xff10;
  do {
    uVar4 = uVar2;
    if (((int)(uVar4 - 0xff10) < 0xf0) || (0xffff00ff < uVar4 - 0x1ff10)) {
      return (uint)*puVar5;
    }
    if (uVar4 - 0x1000d < 3) {
      uVar4 = uVar4 - 0x1000d;
      t = (this->m).timers + uVar4;
      if (t->next_time <= time) {
        run_timer_(this,t,time);
      }
      iVar3 = (this->m).timers[uVar4].counter;
      (this->m).timers[uVar4].counter = 0;
      return iVar3;
    }
    puVar5 = puVar5 + -0x10000;
    uVar2 = uVar4 - 0x10000;
  } while (uVar4 - 0x1000d < 0xffffff03);
  if (uVar4 - 0x10002 < 2) {
    if (uVar2 == 3) {
      iVar3 = dsp_read(this,time);
      return iVar3;
    }
    bVar1 = (this->m).smp_regs[0][2];
  }
  else {
    bVar1 = (this->m).smp_regs[1][uVar2];
  }
  return (uint)bVar1;
}

Assistant:

int Snes_Spc::cpu_read( int addr, rel_time_t time )
{
	MEM_ACCESS( time, addr )
	
	// RAM
	int result = RAM [addr];
	int reg = addr - 0xF0;
	if ( reg >= 0 ) // 40%
	{
		reg -= 0x10;
		if ( (unsigned) reg >= 0xFF00 ) // 21%
		{
			reg += 0x10 - r_t0out;
			
			// Timers
			if ( (unsigned) reg < timer_count ) // 90%
			{
				Timer* t = &m.timers [reg];
				if ( time >= t->next_time )
					t = run_timer_( t, time );
				result = t->counter;
				t->counter = 0;
			}
			// Other registers
			else if ( reg < 0 ) // 10%
			{
				result = cpu_read_smp_reg( reg + r_t0out, time );
			}
			else // 1%
			{
				assert( reg + (r_t0out + 0xF0 - 0x10000) < 0x100 );
				result = cpu_read( reg + (r_t0out + 0xF0 - 0x10000), time );
			}
		}
	}
	
	return result;
}